

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_buffer.h
# Opt level: O0

StringBuffer * __thiscall MeCab::StringBuffer::operator<<(StringBuffer *this,int n)

{
  StringBuffer *pSVar1;
  size_t in_RCX;
  void *__buf;
  StringBuffer *in_RDI;
  char fbuf [64];
  char *in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffb4;
  
  itoa<int>(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffa8);
  pSVar1 = (StringBuffer *)write(in_RDI,(int)&stack0xffffffffffffffa8,__buf,in_RCX);
  return pSVar1;
}

Assistant:

StringBuffer& operator<<(int n)                { _ITOA(n); }